

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeIndirectComputeDispatchTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::compute::anon_unknown_1::IndirectDispatchInstanceBufferUpload::iterate
          (TestStatus *__return_storage_ptr__,IndirectDispatchInstanceBufferUpload *this)

{
  deInt32 *pdVar1;
  deUint32 *pdVar2;
  pointer *ppVVar3;
  TestContext *pTVar4;
  TestLog *log;
  DeviceInterface *pDVar5;
  VkDevice pVVar6;
  Allocator *pAVar7;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *this_00;
  SharedPtrStateBase *pSVar8;
  void *pvVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 obj;
  undefined8 commandBuffer;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  long *plVar15;
  ulong uVar16;
  InstanceInterface *pIVar17;
  VkPhysicalDevice pVVar18;
  const_iterator cVar19;
  DescriptorPoolBuilder *this_01;
  Unique<vk::Handle<(vk::HandleType)22>_> *pUVar20;
  SharedPtrStateBase *pSVar21;
  pointer pDVar22;
  Allocation *pAVar23;
  uint *puVar24;
  pointer pVVar25;
  long *plVar26;
  long lVar27;
  pointer pSVar28;
  VkDeviceSize bufferSize;
  undefined4 *puVar29;
  uint uVar30;
  VkDeviceSize VVar31;
  ulong uVar32;
  VkDeviceSize VVar33;
  bool bVar34;
  bool bVar35;
  ulong local_590;
  VkBufferMemoryBarrier ssboPostBarrier;
  Buffer resultBuffer;
  DescriptorSetLayoutBuilder layoutBuilder;
  Buffer indirectBuffer;
  ScopedLogSection section;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_450;
  VkDescriptorBufferInfo resultDescriptorInfo;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  descriptorSets;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_400;
  VkDescriptorSetLayout local_3e8;
  Deleter<vk::Handle<(vk::HandleType)19>_> DStack_3e0;
  VkCommandPool local_3c8;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_3c0;
  VkDescriptorPool local_3a8;
  Deleter<vk::Handle<(vk::HandleType)21>_> DStack_3a0;
  VkPipeline local_388;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_380;
  VkPhysicalDeviceProperties deviceProperties;
  
  pTVar4 = this->m_context->m_testCtx;
  deviceProperties._0_8_ = pTVar4->m_log;
  pdVar2 = &deviceProperties.vendorID;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pdVar2,"GL_DISPATCH_INDIRECT_BUFFER size = ",0x23);
  std::ostream::_M_insert<unsigned_long>((ulong)pdVar2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&deviceProperties,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar2);
  std::ios_base::~ios_base((ios_base *)(deviceProperties.deviceName + 100));
  log = pTVar4->m_log;
  layoutBuilder.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&layoutBuilder.m_bindings.
                 super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>((string *)&layoutBuilder,"Commands","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&deviceProperties);
  std::ostream::_M_insert<unsigned_long>((ulong)&deviceProperties);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&deviceProperties);
  std::ios_base::~ios_base((ios_base *)(deviceProperties.deviceName + 0x5c));
  plVar15 = (long *)std::__cxx11::string::replace((ulong)&indirectBuffer,0,(char *)0x0,0xb663eb);
  resultBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
  m_data.ptr = (Allocation *)&resultBuffer.m_buffer;
  pAVar23 = (Allocation *)(plVar15 + 2);
  if ((Allocation *)*plVar15 == pAVar23) {
    resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
         (deUint64)pAVar23->_vptr_Allocation;
    resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface
         = (DeviceInterface *)plVar15[3];
  }
  else {
    resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
         (deUint64)pAVar23->_vptr_Allocation;
    resultBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)*plVar15;
  }
  resultBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
  m_data._8_8_ = plVar15[1];
  *plVar15 = (long)pAVar23;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&resultBuffer);
  plVar26 = plVar15 + 2;
  if ((long *)*plVar15 == plVar26) {
    ssboPostBarrier._16_8_ = *plVar26;
    ssboPostBarrier._24_8_ = plVar15[3];
    ssboPostBarrier._0_8_ = &ssboPostBarrier.srcAccessMask;
  }
  else {
    ssboPostBarrier._16_8_ = *plVar26;
    ssboPostBarrier._0_8_ = (long *)*plVar15;
  }
  ssboPostBarrier.pNext = (void *)plVar15[1];
  *plVar15 = (long)plVar26;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  tcu::ScopedLogSection::ScopedLogSection
            (&section,log,(string *)&layoutBuilder,(string *)&ssboPostBarrier);
  if ((VkAccessFlags *)ssboPostBarrier._0_8_ != &ssboPostBarrier.srcAccessMask) {
    operator_delete((void *)ssboPostBarrier._0_8_,ssboPostBarrier._16_8_ + 1);
  }
  if (resultBuffer.m_allocation.
      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr !=
      (Allocation *)&resultBuffer.m_buffer) {
    operator_delete(resultBuffer.m_allocation.
                    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr
                    ,resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                     object.m_internal + 1);
  }
  if (indirectBuffer.m_allocation.
      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr !=
      (Allocation *)&indirectBuffer.m_buffer) {
    operator_delete(indirectBuffer.m_allocation.
                    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr
                    ,indirectBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                     object.m_internal + 1);
  }
  if (layoutBuilder.m_bindings.
      super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)&layoutBuilder.m_bindings.
                super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(layoutBuilder.m_bindings.
                    super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&(layoutBuilder.m_bindings.
                                    super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->binding + 1
                           ));
  }
  if ((this->m_dispatchCommands).
      super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->m_dispatchCommands).
      super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pdVar2 = &deviceProperties.vendorID;
    uVar16 = 0;
    uVar32 = 1;
    do {
      deviceProperties._0_8_ = pTVar4->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar2);
      std::ostream::_M_insert<unsigned_long>((ulong)pdVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pdVar2,": ",2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pdVar2,"offset = ",9);
      std::ostream::_M_insert<long>((long)pdVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pdVar2,", numWorkGroups = ",0x12);
      tcu::operator<<((ostream *)pdVar2,
                      &(this->m_dispatchCommands).
                       super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar16].m_numWorkGroups);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&deviceProperties,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar2);
      std::ios_base::~ios_base((ios_base *)(deviceProperties.deviceName + 100));
      uVar16 = ((long)(this->m_dispatchCommands).
                      super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->m_dispatchCommands).
                      super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      bVar34 = uVar32 <= uVar16;
      lVar27 = uVar16 - uVar32;
      uVar16 = uVar32;
      uVar32 = (ulong)((int)uVar32 + 1);
    } while (bVar34 && lVar27 != 0);
  }
  tcu::TestLog::endSection(section.m_log);
  pIVar17 = Context::getInstanceInterface(this->m_context);
  pVVar18 = Context::getPhysicalDevice(this->m_context);
  (*pIVar17->_vptr_InstanceInterface[5])(pIVar17,pVVar18,&deviceProperties);
  VVar31 = 0x10;
  if ((deviceProperties.limits.minStorageBufferOffsetAlignment != 0) &&
     (auVar10._8_8_ = 0, auVar10._0_8_ = deviceProperties.limits.minStorageBufferOffsetAlignment,
     auVar11 = ZEXT816(0) << 0x40 | ZEXT816(0x10), SUB168(auVar11 % auVar10,0) != 0)) {
    VVar31 = (SUB168(auVar11 / auVar10,0) + 1) *
             deviceProperties.limits.minStorageBufferOffsetAlignment;
  }
  bufferSize = (uint)((int)((ulong)((long)(this->m_dispatchCommands).
                                          super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->m_dispatchCommands).
                                         super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                     -0x55555555) * VVar31;
  pDVar5 = this->m_device_interface;
  pVVar6 = this->m_device;
  pAVar7 = this->m_allocator;
  makeBufferCreateInfo((VkBufferCreateInfo *)&deviceProperties,bufferSize,0x20);
  compute::Buffer::Buffer
            (&resultBuffer,pDVar5,pVVar6,pAVar7,(VkBufferCreateInfo *)&deviceProperties,
             (MemoryRequirement)0x1);
  pDVar22 = (this->m_dispatchCommands).
            super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar27 = (long)(this->m_dispatchCommands).
                 super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar22;
  if (lVar27 != 0) {
    uVar16 = (lVar27 >> 3) * -0x5555555555555555;
    puVar29 = (undefined4 *)
              ((long)(resultBuffer.m_allocation.
                      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                     ptr)->m_hostPtr + 0xc);
    puVar24 = (pDVar22->m_numWorkGroups).m_data + 2;
    uVar30 = 1;
    do {
      puVar29[-3] = ((UVec3 *)(puVar24 + -2))->m_data[0];
      puVar29[-2] = puVar24[-1];
      puVar29[-1] = *puVar24;
      *puVar29 = 0;
      uVar32 = (ulong)uVar30;
      puVar29 = (undefined4 *)((long)puVar29 + VVar31);
      puVar24 = puVar24 + 6;
      uVar30 = uVar30 + 1;
    } while (uVar32 <= uVar16 && uVar16 - uVar32 != 0);
  }
  ::vk::flushMappedMemoryRange
            (this->m_device_interface,this->m_device,
             (VkDeviceMemory)
             ((resultBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (resultBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,bufferSize);
  ppVVar3 = &layoutBuilder.m_bindings.
             super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pDVar5 = this->m_device_interface;
  pVVar6 = this->m_device;
  this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
             *)this->m_context->m_progCollection;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &ssboPostBarrier,"indirect_dispatch_",&this->m_name);
  plVar15 = (long *)std::__cxx11::string::append((char *)&ssboPostBarrier);
  pVVar25 = (pointer)(plVar15 + 2);
  if ((pointer)*plVar15 == pVVar25) {
    layoutBuilder.m_bindings.
    super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)pVVar25;
    layoutBuilder.m_immutableSamplerInfos.
    super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar15[3];
    layoutBuilder.m_bindings.
    super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppVVar3;
  }
  else {
    layoutBuilder.m_bindings.
    super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)pVVar25;
    layoutBuilder.m_bindings.
    super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar15;
  }
  layoutBuilder.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar15[1];
  *plVar15 = (long)pVVar25;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  cVar19 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(this_00,(key_type *)&layoutBuilder);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&deviceProperties,pDVar5,pVVar6,
             *(ProgramBinary **)(cVar19._M_node + 2),0);
  DStack_450.m_device = (VkDevice)deviceProperties._16_8_;
  DStack_450.m_allocator = (VkAllocationCallbacks *)deviceProperties.deviceName._4_8_;
  section.m_log = (TestLog *)deviceProperties._0_8_;
  DStack_450.m_deviceIface = (DeviceInterface *)deviceProperties._8_8_;
  deviceProperties.apiVersion = 0;
  deviceProperties.driverVersion = 0;
  deviceProperties.vendorID = 0;
  deviceProperties.deviceID = 0;
  deviceProperties.deviceType = VK_PHYSICAL_DEVICE_TYPE_OTHER;
  deviceProperties.deviceName[0] = '\0';
  deviceProperties.deviceName[1] = '\0';
  deviceProperties.deviceName[2] = '\0';
  deviceProperties.deviceName[3] = '\0';
  deviceProperties.deviceName[4] = '\0';
  deviceProperties.deviceName[5] = '\0';
  deviceProperties.deviceName[6] = '\0';
  deviceProperties.deviceName[7] = '\0';
  deviceProperties.deviceName[8] = '\0';
  deviceProperties.deviceName[9] = '\0';
  deviceProperties.deviceName[10] = '\0';
  deviceProperties.deviceName[0xb] = '\0';
  if (layoutBuilder.m_bindings.
      super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppVVar3) {
    operator_delete(layoutBuilder.m_bindings.
                    super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&(layoutBuilder.m_bindings.
                                    super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->binding + 1
                           ));
  }
  if ((VkAccessFlags *)ssboPostBarrier._0_8_ != &ssboPostBarrier.srcAccessMask) {
    operator_delete((void *)ssboPostBarrier._0_8_,ssboPostBarrier._16_8_ + 1);
  }
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder(&layoutBuilder);
  ::vk::DescriptorSetLayoutBuilder::addBinding
            (&layoutBuilder,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,0x20,(VkSampler *)0x0);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&deviceProperties,&layoutBuilder,
             this->m_device_interface,this->m_device,0);
  DStack_3e0.m_device = (VkDevice)deviceProperties._16_8_;
  DStack_3e0.m_allocator = (VkAllocationCallbacks *)deviceProperties.deviceName._4_8_;
  local_3e8.m_internal._0_4_ = deviceProperties.apiVersion;
  local_3e8.m_internal._4_4_ = deviceProperties.driverVersion;
  DStack_3e0.m_deviceIface = (DeviceInterface *)deviceProperties._8_8_;
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&deviceProperties,
                     this->m_device_interface,this->m_device,
                     (VkDescriptorSetLayout)deviceProperties._0_8_);
  obj = deviceProperties._0_8_;
  DStack_400.m_device = (VkDevice)deviceProperties._16_8_;
  DStack_400.m_allocator = (VkAllocationCallbacks *)deviceProperties.deviceName._4_8_;
  DStack_400.m_deviceIface = (DeviceInterface *)deviceProperties._8_8_;
  makeComputePipeline((Move<vk::Handle<(vk::HandleType)18>_> *)&deviceProperties,
                      this->m_device_interface,this->m_device,
                      (VkPipelineLayout)deviceProperties._0_8_,(VkShaderModule)section.m_log);
  DStack_380.m_device = (VkDevice)deviceProperties._16_8_;
  DStack_380.m_allocator = (VkAllocationCallbacks *)deviceProperties.deviceName._4_8_;
  local_388.m_internal._0_4_ = deviceProperties.apiVersion;
  local_388.m_internal._4_4_ = deviceProperties.driverVersion;
  DStack_380.m_deviceIface = (DeviceInterface *)deviceProperties._8_8_;
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&ssboPostBarrier);
  this_01 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&ssboPostBarrier,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
                       (int)((ulong)((long)(this->m_dispatchCommands).
                                           super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->m_dispatchCommands).
                                          super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                       -0x55555555);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&deviceProperties,this_01,
             this->m_device_interface,this->m_device,1,
             (int)((ulong)((long)(this->m_dispatchCommands).
                                 super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->m_dispatchCommands).
                                super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555);
  DStack_3a0.m_device = (VkDevice)deviceProperties._16_8_;
  DStack_3a0.m_allocator = (VkAllocationCallbacks *)deviceProperties.deviceName._4_8_;
  local_3a8.m_internal._0_4_ = deviceProperties.apiVersion;
  local_3a8.m_internal._4_4_ = deviceProperties.driverVersion;
  DStack_3a0.m_deviceIface = (DeviceInterface *)deviceProperties._8_8_;
  deviceProperties.apiVersion = 0;
  deviceProperties.driverVersion = 0;
  deviceProperties.vendorID = 0;
  deviceProperties.deviceID = 0;
  deviceProperties.deviceType = VK_PHYSICAL_DEVICE_TYPE_OTHER;
  deviceProperties.deviceName[0] = '\0';
  deviceProperties.deviceName[1] = '\0';
  deviceProperties.deviceName[2] = '\0';
  deviceProperties.deviceName[3] = '\0';
  deviceProperties.deviceName[4] = '\0';
  deviceProperties.deviceName[5] = '\0';
  deviceProperties.deviceName[6] = '\0';
  deviceProperties.deviceName[7] = '\0';
  deviceProperties.deviceName[8] = '\0';
  deviceProperties.deviceName[9] = '\0';
  deviceProperties.deviceName[10] = '\0';
  deviceProperties.deviceName[0xb] = '\0';
  if (ssboPostBarrier._0_8_ != 0) {
    operator_delete((void *)ssboPostBarrier._0_8_,ssboPostBarrier._16_8_ - ssboPostBarrier._0_8_);
  }
  makeBufferMemoryBarrier
            (&ssboPostBarrier,0x40,0x2000,
             (VkBuffer)
             resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,bufferSize);
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)&deviceProperties,
                  this->m_device_interface,this->m_device,this->m_queueFamilyIndex);
  DStack_3c0.m_device = (VkDevice)deviceProperties._16_8_;
  DStack_3c0.m_allocator = (VkAllocationCallbacks *)deviceProperties.deviceName._4_8_;
  local_3c8.m_internal._0_4_ = deviceProperties.apiVersion;
  local_3c8.m_internal._4_4_ = deviceProperties.driverVersion;
  DStack_3c0.m_deviceIface = (DeviceInterface *)deviceProperties._8_8_;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&deviceProperties,this->m_device_interface,
             this->m_device,(VkCommandPool)deviceProperties._0_8_,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  uVar14 = deviceProperties.deviceName._4_8_;
  uVar13 = deviceProperties._16_8_;
  uVar12 = deviceProperties._8_8_;
  commandBuffer = deviceProperties._0_8_;
  beginCommandBuffer(this->m_device_interface,(VkCommandBuffer)deviceProperties._0_8_);
  pDVar5 = this->m_device_interface;
  pVVar6 = this->m_device;
  pAVar7 = this->m_allocator;
  makeBufferCreateInfo((VkBufferCreateInfo *)&deviceProperties,this->m_bufferSize,0x120);
  compute::Buffer::Buffer
            (&indirectBuffer,pDVar5,pVVar6,pAVar7,(VkBufferCreateInfo *)&deviceProperties,
             (MemoryRequirement)0x1);
  (*(this->super_TestInstance)._vptr_TestInstance[3])(this,commandBuffer,&indirectBuffer);
  (*this->m_device_interface->_vptr_DeviceInterface[0x4c])
            (this->m_device_interface,commandBuffer,1,local_388.m_internal);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  ::vector(&descriptorSets,
           ((long)(this->m_dispatchCommands).
                  super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->m_dispatchCommands).
                  super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
           (allocator_type *)&deviceProperties);
  if ((this->m_dispatchCommands).
      super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->m_dispatchCommands).
      super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar30 = 1;
    local_590 = 0;
    VVar33 = 0;
    do {
      pUVar20 = (Unique<vk::Handle<(vk::HandleType)22>_> *)operator_new(0x20);
      makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&deviceProperties,
                        this->m_device_interface,this->m_device,local_3a8,local_3e8);
      (pUVar20->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_device =
           (VkDevice)deviceProperties._16_8_;
      (pUVar20->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_pool.m_internal =
           deviceProperties.deviceName._4_8_;
      (pUVar20->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.m_internal =
           deviceProperties._0_8_;
      (pUVar20->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_deviceIface =
           (DeviceInterface *)deviceProperties._8_8_;
      deviceProperties.apiVersion = 0;
      deviceProperties.driverVersion = 0;
      deviceProperties.vendorID = 0;
      deviceProperties.deviceID = 0;
      deviceProperties.deviceType = VK_PHYSICAL_DEVICE_TYPE_OTHER;
      deviceProperties.deviceName[0] = '\0';
      deviceProperties.deviceName[1] = '\0';
      deviceProperties.deviceName[2] = '\0';
      deviceProperties.deviceName[3] = '\0';
      deviceProperties.deviceName[4] = '\0';
      deviceProperties.deviceName[5] = '\0';
      deviceProperties.deviceName[6] = '\0';
      deviceProperties.deviceName[7] = '\0';
      deviceProperties.deviceName[8] = '\0';
      deviceProperties.deviceName[9] = '\0';
      deviceProperties.deviceName[10] = '\0';
      deviceProperties.deviceName[0xb] = '\0';
      pSVar21 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar21->strongRefCount = 0;
      pSVar21->weakRefCount = 0;
      pSVar21->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00d53860;
      pSVar21[1]._vptr_SharedPtrStateBase = (_func_int **)pUVar20;
      pSVar21->strongRefCount = 1;
      pSVar21->weakRefCount = 1;
      pSVar8 = descriptorSets.
               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[local_590].m_state;
      if (pSVar8 != pSVar21) {
        pSVar28 = descriptorSets.
                  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + local_590;
        if (pSVar8 != (SharedPtrStateBase *)0x0) {
          LOCK();
          pdVar1 = &pSVar8->strongRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            pSVar28->m_ptr = (Unique<vk::Handle<(vk::HandleType)22>_> *)0x0;
            (*pSVar28->m_state->_vptr_SharedPtrStateBase[2])();
          }
          LOCK();
          pdVar1 = &pSVar28->m_state->weakRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            if (pSVar28->m_state != (SharedPtrStateBase *)0x0) {
              (*pSVar28->m_state->_vptr_SharedPtrStateBase[1])();
            }
            pSVar28->m_state = (SharedPtrStateBase *)0x0;
          }
        }
        pSVar28->m_ptr = pUVar20;
        pSVar28->m_state = pSVar21;
        LOCK();
        pSVar21->strongRefCount = pSVar21->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar1 = &pSVar28->m_state->weakRefCount;
        *pdVar1 = *pdVar1 + 1;
        UNLOCK();
      }
      LOCK();
      pdVar1 = &pSVar21->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (*pSVar21->_vptr_SharedPtrStateBase[2])(pSVar21);
      }
      LOCK();
      pdVar1 = &pSVar21->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (*pSVar21->_vptr_SharedPtrStateBase[1])(pSVar21);
      }
      if (deviceProperties._0_8_ != 0) {
        resultDescriptorInfo.buffer.m_internal._0_4_ = deviceProperties.apiVersion;
        resultDescriptorInfo.buffer.m_internal._4_4_ = deviceProperties.driverVersion;
        (**(code **)(*(long *)deviceProperties._8_8_ + 0x1e8))
                  (deviceProperties._8_8_,deviceProperties._16_8_,deviceProperties.deviceName._4_8_,
                   1,&resultDescriptorInfo);
      }
      resultDescriptorInfo.buffer.m_internal =
           resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
           m_internal;
      resultDescriptorInfo.offset = VVar33;
      resultDescriptorInfo.range = VVar31;
      ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
                ((DescriptorSetUpdateBuilder *)&deviceProperties);
      ::vk::DescriptorSetUpdateBuilder::write
                ((DescriptorSetUpdateBuilder *)&deviceProperties,
                 (int)((descriptorSets.
                        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[local_590].m_ptr)->
                      super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.m_internal,
                 (void *)0x0,0);
      ::vk::DescriptorSetUpdateBuilder::update
                ((DescriptorSetUpdateBuilder *)&deviceProperties,this->m_device_interface,
                 this->m_device);
      (*this->m_device_interface->_vptr_DeviceInterface[0x56])
                (this->m_device_interface,commandBuffer,1,obj,0,1,
                 descriptorSets.
                 super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[local_590].m_ptr,0,0);
      (*this->m_device_interface->_vptr_DeviceInterface[0x5e])
                (this->m_device_interface,commandBuffer,
                 indirectBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object
                 .m_internal,
                 (this->m_dispatchCommands).
                 super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                 ._M_impl.super__Vector_impl_data._M_start[local_590].m_offset);
      if (deviceProperties.deviceName._28_8_ != 0) {
        operator_delete((void *)deviceProperties.deviceName._28_8_,
                        deviceProperties.deviceName._44_8_ - deviceProperties.deviceName._28_8_);
      }
      if (deviceProperties.deviceName._4_8_ != 0) {
        operator_delete((void *)deviceProperties.deviceName._4_8_,
                        deviceProperties.deviceName._20_8_ - deviceProperties.deviceName._4_8_);
      }
      VVar33 = VVar33 + VVar31;
      std::
      vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
      ::~vector((vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
                 *)&deviceProperties);
      local_590 = (ulong)uVar30;
      uVar16 = ((long)(this->m_dispatchCommands).
                      super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->m_dispatchCommands).
                      super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      uVar30 = uVar30 + 1;
    } while (local_590 <= uVar16 && uVar16 - local_590 != 0);
  }
  (*this->m_device_interface->_vptr_DeviceInterface[0x6d])
            (this->m_device_interface,commandBuffer,0x800,0x4000,0,0,0,1,&ssboPostBarrier,0,0);
  endCommandBuffer(this->m_device_interface,(VkCommandBuffer)commandBuffer);
  submitCommandsAndWait
            (this->m_device_interface,this->m_device,this->m_queue,(VkCommandBuffer)commandBuffer);
  pAVar23 = resultBuffer.m_allocation.
            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            (this->m_device_interface,this->m_device,
             (VkDeviceMemory)
             ((resultBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (resultBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,bufferSize);
  pDVar22 = (this->m_dispatchCommands).
            super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_dispatchCommands).
      super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ._M_impl.super__Vector_impl_data._M_finish != pDVar22) {
    pvVar9 = pAVar23->m_hostPtr;
    pdVar2 = &deviceProperties.vendorID;
    bVar34 = true;
    uVar16 = 0;
    uVar32 = 1;
    do {
      if (*(int *)((long)pvVar9 + uVar16 * VVar31 + 0xc) !=
          (this->m_workGroupSize).m_data[1] * (this->m_workGroupSize).m_data[0] *
          (this->m_workGroupSize).m_data[2] * pDVar22[uVar16].m_numWorkGroups.m_data[0] *
          pDVar22[uVar16].m_numWorkGroups.m_data[1] * pDVar22[uVar16].m_numWorkGroups.m_data[2]) {
        deviceProperties._0_8_ = this->m_context->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pdVar2,"ERROR: got invalid result for invocation ",0x29);
        std::ostream::_M_insert<unsigned_long>((ulong)pdVar2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pdVar2,": got numPassed = ",0x12);
        std::ostream::_M_insert<unsigned_long>((ulong)pdVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pdVar2,", expected ",0xb);
        std::ostream::_M_insert<unsigned_long>((ulong)pdVar2);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&deviceProperties,(EndMessageToken *)&tcu::TestLog::EndMessage)
        ;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar2);
        std::ios_base::~ios_base((ios_base *)(deviceProperties.deviceName + 100));
        bVar34 = false;
      }
      pDVar22 = (this->m_dispatchCommands).
                super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar16 = ((long)(this->m_dispatchCommands).
                      super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar22 >> 3) *
               -0x5555555555555555;
      bVar35 = uVar32 <= uVar16;
      lVar27 = uVar16 - uVar32;
      uVar16 = uVar32;
      uVar32 = (ulong)((int)uVar32 + 1);
    } while (bVar35 && lVar27 != 0);
    if (!bVar34) {
      deviceProperties._0_8_ = &deviceProperties.deviceType;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&deviceProperties,"Invalid values in result buffer","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,deviceProperties._0_8_,
                 deviceProperties._8_8_ + deviceProperties._0_8_);
      goto LAB_00737a6a;
    }
  }
  deviceProperties._0_8_ = &deviceProperties.deviceType;
  std::__cxx11::string::_M_construct<char_const*>((string *)&deviceProperties,"Pass","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,deviceProperties._0_8_,
             deviceProperties._8_8_ + deviceProperties._0_8_);
LAB_00737a6a:
  if ((VkPhysicalDeviceType *)deviceProperties._0_8_ != &deviceProperties.deviceType) {
    operator_delete((void *)deviceProperties._0_8_,deviceProperties._16_8_ + 1);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  ::~vector(&descriptorSets);
  if (indirectBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
      != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&indirectBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter
               ,(VkBuffer)
                indirectBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                m_internal);
  }
  indirectBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  indirectBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  indirectBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0
  ;
  indirectBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  if (indirectBuffer.m_allocation.
      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr !=
      (Allocation *)0x0) {
    (*(indirectBuffer.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
      _vptr_Allocation[1])();
    indirectBuffer.m_allocation.
    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
         (Allocation *)0x0;
  }
  if (commandBuffer != 0) {
    deviceProperties._0_8_ = commandBuffer;
    (**(code **)(*(long *)uVar12 + 0x240))(uVar12,uVar13,uVar14,1);
  }
  if (local_3c8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_3c0,local_3c8);
  }
  if (local_3a8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()(&DStack_3a0,local_3a8);
  }
  if (local_388.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()(&DStack_380,local_388);
  }
  if (obj != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              (&DStack_400,(VkPipelineLayout)obj);
  }
  if (local_3e8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()(&DStack_3e0,local_3e8);
  }
  if (layoutBuilder.m_immutableSamplers.
      super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(layoutBuilder.m_immutableSamplers.
                    super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)layoutBuilder.m_immutableSamplers.
                          super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)layoutBuilder.m_immutableSamplers.
                          super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (layoutBuilder.m_immutableSamplerInfos.
      super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(layoutBuilder.m_immutableSamplerInfos.
                    super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)layoutBuilder.m_immutableSamplerInfos.
                          super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)layoutBuilder.m_immutableSamplerInfos.
                          super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (layoutBuilder.m_bindings.
      super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(layoutBuilder.m_bindings.
                    super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)layoutBuilder.m_bindings.
                          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)layoutBuilder.m_bindings.
                          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (section.m_log != (TestLog *)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              (&DStack_450,(VkShaderModule)section.m_log);
  }
  if (resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
      != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  if (resultBuffer.m_allocation.
      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr !=
      (Allocation *)0x0) {
    (*(resultBuffer.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
      _vptr_Allocation[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus IndirectDispatchInstanceBufferUpload::iterate (void)
{
	tcu::TestContext& testCtx = m_context.getTestContext();

	testCtx.getLog() << tcu::TestLog::Message << "GL_DISPATCH_INDIRECT_BUFFER size = " << m_bufferSize << tcu::TestLog::EndMessage;
	{
		tcu::ScopedLogSection section(testCtx.getLog(), "Commands", "Indirect Dispatch Commands (" + de::toString(m_dispatchCommands.size()) + " in total)");

		for (deUint32 cmdNdx = 0; cmdNdx < m_dispatchCommands.size(); ++cmdNdx)
		{
			testCtx.getLog()
				<< tcu::TestLog::Message
				<< cmdNdx << ": " << "offset = " << m_dispatchCommands[cmdNdx].m_offset << ", numWorkGroups = " << m_dispatchCommands[cmdNdx].m_numWorkGroups
				<< tcu::TestLog::EndMessage;
		}
	}

	// Create result buffer
	const vk::VkDeviceSize resultBlockSize = getResultBlockAlignedSize(m_context.getInstanceInterface(), m_context.getPhysicalDevice(), RESULT_BLOCK_BASE_SIZE);
	const vk::VkDeviceSize resultBufferSize = resultBlockSize * (deUint32)m_dispatchCommands.size();

	Buffer resultBuffer(
		m_device_interface, m_device, m_allocator,
		makeBufferCreateInfo(resultBufferSize, vk::VK_BUFFER_USAGE_STORAGE_BUFFER_BIT),
		vk::MemoryRequirement::HostVisible);

	{
		const vk::Allocation& alloc = resultBuffer.getAllocation();
		deUint8* resultDataPtr = reinterpret_cast<deUint8*>(alloc.getHostPtr());

		for (deUint32 cmdNdx = 0; cmdNdx < m_dispatchCommands.size(); ++cmdNdx)
		{
			deUint8* const	dstPtr = &resultDataPtr[resultBlockSize*cmdNdx];

			*(deUint32*)(dstPtr + 0 * sizeof(deUint32)) = m_dispatchCommands[cmdNdx].m_numWorkGroups[0];
			*(deUint32*)(dstPtr + 1 * sizeof(deUint32)) = m_dispatchCommands[cmdNdx].m_numWorkGroups[1];
			*(deUint32*)(dstPtr + 2 * sizeof(deUint32)) = m_dispatchCommands[cmdNdx].m_numWorkGroups[2];
			*(deUint32*)(dstPtr + RESULT_BLOCK_NUM_PASSED_OFFSET) = 0;
		}

		vk::flushMappedMemoryRange(m_device_interface, m_device, alloc.getMemory(), alloc.getOffset(), resultBufferSize);
	}

	// Create verify compute shader
	const vk::Unique<vk::VkShaderModule> verifyShader(createShaderModule(
		m_device_interface, m_device, m_context.getBinaryCollection().get("indirect_dispatch_" + m_name + "_verify"), 0u));

	// Create descriptorSetLayout
	vk::DescriptorSetLayoutBuilder layoutBuilder;
	layoutBuilder.addSingleBinding(vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, vk::VK_SHADER_STAGE_COMPUTE_BIT);
	vk::Unique<vk::VkDescriptorSetLayout> descriptorSetLayout(layoutBuilder.build(m_device_interface, m_device));

	// Create compute pipeline
	const vk::Unique<vk::VkPipelineLayout> pipelineLayout(makePipelineLayout(m_device_interface, m_device, *descriptorSetLayout));
	const vk::Unique<vk::VkPipeline> computePipeline(makeComputePipeline(m_device_interface, m_device, *pipelineLayout, *verifyShader));

	// Create descriptor pool
	const vk::Unique<vk::VkDescriptorPool> descriptorPool(
		vk::DescriptorPoolBuilder()
		.addType(vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, (deUint32)m_dispatchCommands.size())
		.build(m_device_interface, m_device, vk::VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, static_cast<deUint32>(m_dispatchCommands.size())));

	const vk::VkBufferMemoryBarrier ssboPostBarrier = makeBufferMemoryBarrier(
		vk::VK_ACCESS_SHADER_WRITE_BIT, vk::VK_ACCESS_HOST_READ_BIT, *resultBuffer, 0ull, resultBufferSize);

	// Create command buffer
	const vk::Unique<vk::VkCommandPool> cmdPool(makeCommandPool(m_device_interface, m_device, m_queueFamilyIndex));
	const vk::Unique<vk::VkCommandBuffer> cmdBuffer(allocateCommandBuffer(m_device_interface, m_device, *cmdPool, vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	// Begin recording commands
	beginCommandBuffer(m_device_interface, *cmdBuffer);

	// Create indirect buffer
	Buffer indirectBuffer(
		m_device_interface, m_device, m_allocator,
		makeBufferCreateInfo(m_bufferSize, vk::VK_BUFFER_USAGE_INDIRECT_BUFFER_BIT | vk::VK_BUFFER_USAGE_STORAGE_BUFFER_BIT),
		vk::MemoryRequirement::HostVisible);
	fillIndirectBufferData(*cmdBuffer, indirectBuffer);

	// Bind compute pipeline
	m_device_interface.cmdBindPipeline(*cmdBuffer, vk::VK_PIPELINE_BIND_POINT_COMPUTE, *computePipeline);

	// Allocate descriptor sets
	typedef de::SharedPtr<vk::Unique<vk::VkDescriptorSet> > SharedVkDescriptorSet;
	std::vector<SharedVkDescriptorSet> descriptorSets(m_dispatchCommands.size());

	vk::VkDeviceSize curOffset = 0;

	// Create descriptor sets
	for (deUint32 cmdNdx = 0; cmdNdx < m_dispatchCommands.size(); ++cmdNdx)
	{
		descriptorSets[cmdNdx] = SharedVkDescriptorSet(new vk::Unique<vk::VkDescriptorSet>(
									makeDescriptorSet(m_device_interface, m_device, *descriptorPool, *descriptorSetLayout)));

		const vk::VkDescriptorBufferInfo resultDescriptorInfo = makeDescriptorBufferInfo(*resultBuffer, curOffset, resultBlockSize);

		vk::DescriptorSetUpdateBuilder descriptorSetBuilder;
		descriptorSetBuilder.writeSingle(**descriptorSets[cmdNdx], vk::DescriptorSetUpdateBuilder::Location::binding(0u), vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &resultDescriptorInfo);
		descriptorSetBuilder.update(m_device_interface, m_device);

		// Bind descriptor set
		m_device_interface.cmdBindDescriptorSets(*cmdBuffer, vk::VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &(**descriptorSets[cmdNdx]), 0u, DE_NULL);

		// Dispatch indirect compute command
		m_device_interface.cmdDispatchIndirect(*cmdBuffer, *indirectBuffer, m_dispatchCommands[cmdNdx].m_offset);

		curOffset += resultBlockSize;
	}

	// Insert memory barrier
	m_device_interface.cmdPipelineBarrier(*cmdBuffer, vk::VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, vk::VK_PIPELINE_STAGE_HOST_BIT, (vk::VkDependencyFlags)0,
										  0, (const vk::VkMemoryBarrier*)DE_NULL,
										  1, &ssboPostBarrier,
										  0, (const vk::VkImageMemoryBarrier*)DE_NULL);

	// End recording commands
	endCommandBuffer(m_device_interface, *cmdBuffer);

	// Wait for command buffer execution finish
	submitCommandsAndWait(m_device_interface, m_device, m_queue, *cmdBuffer);

	// Check if result buffer contains valid values
	if (verifyResultBuffer(resultBuffer, resultBlockSize, resultBufferSize))
		return tcu::TestStatus(QP_TEST_RESULT_PASS, "Pass");
	else
		return tcu::TestStatus(QP_TEST_RESULT_FAIL, "Invalid values in result buffer");
}